

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

Var __thiscall
Js::CustomExternalWrapperObject::GetName
          (CustomExternalWrapperObject *this,ScriptContext *requestContext,PropertyId propertyId,
          Var *isPropertyNameNumeric,Var *propertyNameNumericValue)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  PropertyRecord *propertyRecord;
  PropertyString *pPVar5;
  uint64 uVar6;
  uint64 uVar7;
  undefined4 *puVar8;
  Var pvVar9;
  double value;
  
  propertyRecord = ThreadContext::GetPropertyName(requestContext->threadContext,propertyId);
  if (propertyRecord->isSymbol == true) {
    pPVar5 = (PropertyString *)ScriptContext::GetSymbol(requestContext,propertyRecord);
  }
  else {
    pPVar5 = ScriptContext::GetPropertyString(requestContext,propertyRecord);
  }
  pJVar1 = (requestContext->super_ScriptContextBase).javascriptLibrary;
  if (propertyRecord->isNumeric == false) {
    *isPropertyNameNumeric = (pJVar1->super_JavascriptLibraryBase).booleanFalse.ptr;
    pvVar9 = (Var)0x0;
  }
  else {
    *isPropertyNameNumeric = (pJVar1->super_JavascriptLibraryBase).booleanTrue.ptr;
    uVar4 = PropertyRecord::GetNumericValue(propertyRecord);
    if ((int)uVar4 < 0) {
      value = (double)uVar4;
      uVar6 = NumberUtilities::ToSpecial(value);
      bVar3 = NumberUtilities::IsNan(value);
      if (bVar3) {
        uVar7 = NumberUtilities::ToSpecial(value);
        if (uVar7 != 0xfff8000000000000) {
          uVar7 = NumberUtilities::ToSpecial(value);
          if (uVar7 != 0x7ff8000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar8 = 0;
          }
        }
      }
      pvVar9 = (Var)(uVar6 ^ 0xfffc000000000000);
    }
    else {
      pvVar9 = (Var)((ulong)uVar4 | 0x1000000000000);
    }
  }
  *propertyNameNumericValue = pvVar9;
  return pPVar5;
}

Assistant:

Js::Var CustomExternalWrapperObject::GetName(Js::ScriptContext* requestContext, Js::PropertyId propertyId, Var * isPropertyNameNumeric, Var * propertyNameNumericValue)
{
    const Js::PropertyRecord* propertyRecord = requestContext->GetThreadContext()->GetPropertyName(propertyId);
    Js::Var name;
    if (propertyRecord->IsSymbol())
    {
        name = requestContext->GetSymbol(propertyRecord);
    }
    else
    {
        name = requestContext->GetPropertyString(propertyRecord);
    }

    *isPropertyNameNumeric = propertyRecord->IsNumeric() ? requestContext->GetLibrary()->GetTrue() : requestContext->GetLibrary()->GetFalse();
    *propertyNameNumericValue = propertyRecord->IsNumeric() ? JavascriptNumber::ToVar(propertyRecord->GetNumericValue(), requestContext) : nullptr;
    return name;
}